

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  LogMessage *other_00;
  LogFinisher local_51;
  RepeatedPtrFieldBase temp;
  
  temp.arena_ = other->arena_;
  if (temp.arena_ == this->arena_) {
    LogMessage::LogMessage
              ((LogMessage *)&temp,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x342);
    other_00 = LogMessage::operator<<
                         ((LogMessage *)&temp,"CHECK failed: other->GetArena() != GetArena(): ");
    LogFinisher::operator=(&local_51,other_00);
    LogMessage::~LogMessage((LogMessage *)&temp);
    temp.arena_ = other->arena_;
  }
  temp.current_size_ = 0;
  temp.total_size_ = 0;
  temp.rep_ = (Rep *)0x0;
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(&temp,this);
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(this);
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(this,other);
  InternalSwap(other,&temp);
  Destroy<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(&temp);
  ~RepeatedPtrFieldBase(&temp);
  return;
}

Assistant:

void RepeatedPtrFieldBase::SwapFallback(RepeatedPtrFieldBase* other) {
#ifdef PROTOBUF_FORCE_COPY_IN_SWAP
  GOOGLE_DCHECK(GetArena() == nullptr || other->GetArena() != GetArena());
#else   // PROTOBUF_FORCE_COPY_IN_SWAP
  GOOGLE_DCHECK(other->GetArena() != GetArena());
#endif  // !PROTOBUF_FORCE_COPY_IN_SWAP

  // Copy semantics in this case. We try to improve efficiency by placing the
  // temporary on |other|'s arena so that messages are copied twice rather than
  // three times.
  RepeatedPtrFieldBase temp(other->GetArena());
  temp.MergeFrom<TypeHandler>(*this);
  this->Clear<TypeHandler>();
  this->MergeFrom<TypeHandler>(*other);
  other->InternalSwap(&temp);
  temp.Destroy<TypeHandler>();  // Frees rep_ if `other` had no arena.
}